

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseMemoryModuleField(WastParser *this,Module *module)

{
  ExprList *this_00;
  DataSegmentModuleField *pDVar1;
  bool bVar2;
  Result RVar3;
  reference pvVar4;
  char *pcVar5;
  pointer *__ptr;
  Enum EVar6;
  DataSegmentModuleField *pDVar7;
  DataSegmentModuleField *local_138;
  DataSegmentModuleField *local_130;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_128;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_120;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_118;
  Expr *local_110;
  _Head_base<0UL,_wabt::Expr_*,_false> local_108;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_100;
  Location local_f8;
  string name;
  Location loc;
  ModuleFieldList export_fields;
  Const local_78;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ != Error) {
    GetLocation(&loc,this);
    RVar3 = Expect(this,Memory);
    if (RVar3.enum_ != Error) {
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      ParseBindVarOpt(this,&name);
      export_fields.first_ = (ModuleField *)0x0;
      export_fields.last_ = (ModuleField *)0x0;
      export_fields.size_ = 0;
      RVar3 = ParseInlineExports(this,&export_fields,Memory);
      EVar6 = Error;
      if (RVar3.enum_ != Error) {
        bVar2 = PeekMatchLpar(this,Import);
        if (bVar2) {
          CheckImportOrdering(this,module);
          MakeUnique<wabt::MemoryImport,std::__cxx11::string&>((wabt *)&local_f8,&name);
          RVar3 = ParseInlineImport(this,(Import *)local_f8.filename.data_);
          if ((RVar3.enum_ == Error) ||
             (RVar3 = ParseLimits(this,(Limits *)
                                       ((long)&(((Import *)((long)local_f8.filename.data_ + 0x50))->
                                               module_name).field_2 + 8)), RVar3.enum_ == Error)) {
            if ((Import *)local_f8.filename.data_ != (Import *)0x0) {
              (*(*(_func_int ***)local_f8.filename.data_)[1])();
            }
            goto LAB_00169bdb;
          }
          GetLocation(&local_78.loc,this);
          MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
                    ((wabt *)&local_138,
                     (unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
                     &local_f8,&local_78.loc);
          local_100._M_head_impl = (ImportModuleField *)local_138;
          local_138 = (DataSegmentModuleField *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                      *)&local_100);
          if ((DataSegmentModuleField *)local_100._M_head_impl != (DataSegmentModuleField *)0x0) {
            (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
               &(local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>)->
              super_ModuleField)._vptr_ModuleField[1])();
          }
          local_100._M_head_impl = (ImportModuleField *)0x0;
          if (local_138 != (DataSegmentModuleField *)0x0) {
            (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
               &local_138->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).
              _vptr_ModuleField[1])();
          }
          if ((Import *)local_f8.filename.data_ != (Import *)0x0) {
            (*(*(_func_int ***)local_f8.filename.data_)[1])();
          }
        }
        else {
          bVar2 = MatchLpar(this,Data);
          if (bVar2) {
            MakeUnique<wabt::DataSegmentModuleField,wabt::Location&>((wabt *)&local_138,&loc);
            pDVar7 = local_138;
            local_f8.field_1.field_0.line = 0;
            local_f8.field_1._4_8_ = 0;
            local_f8.filename.data_ = (char *)0x0;
            local_f8.filename.size_._0_4_ = 0;
            local_f8.filename.size_._4_4_ = 0;
            Var::Var((Var *)&local_78,
                     (Index)((ulong)((long)(module->memories).
                                           super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(module->memories).
                                          super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3),&local_f8
                    );
            Var::operator=(&(pDVar7->data_segment).memory_var,(Var *)&local_78);
            Var::~Var((Var *)&local_78);
            local_130 = pDVar7;
            this_00 = &(pDVar7->data_segment).offset;
            local_f8.field_1.field_0.line = 0;
            local_f8.field_1._4_8_ = 0;
            local_f8.filename.data_ = (char *)0x0;
            local_f8.filename.size_._0_4_ = 0;
            local_f8.filename.size_._4_4_ = 0;
            Const::I32(&local_78,0,&local_f8);
            MakeUnique<wabt::ConstExpr,wabt::Const>((wabt *)&local_110,&local_78);
            local_108._M_head_impl = local_110;
            local_110 = (Expr *)0x0;
            intrusive_list<wabt::Expr>::push_back
                      (this_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                               &local_108);
            if (local_108._M_head_impl != (Expr *)0x0) {
              (*(local_108._M_head_impl)->_vptr_Expr[1])();
            }
            local_108._M_head_impl = (Expr *)0x0;
            if (local_110 != (Expr *)0x0) {
              (*local_110->_vptr_Expr[1])();
            }
            pvVar4 = intrusive_list<wabt::Expr>::back(this_00);
            pDVar1 = local_130;
            (pvVar4->loc).filename.data_ = loc.filename.data_;
            (pvVar4->loc).filename.size_ = loc.filename.size_;
            (pvVar4->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
            *(undefined8 *)((long)&(pvVar4->loc).field_1 + 8) = loc.field_1._8_8_;
            ParseTextListOpt(this,&(local_130->data_segment).data);
            RVar3 = Expect(this,Rpar);
            pDVar7 = local_138;
            if (RVar3.enum_ != Error) {
              MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
                        ((wabt *)&local_78,&loc,&name);
              pcVar5 = (char *)(ulong)((*(int *)&(pDVar1->data_segment).data.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                       *(int *)&(pDVar1->data_segment).data.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start) + 0xffffU
                                      >> 0x10);
              *(char **)((long)&(((DataSegment *)((long)local_78.loc.filename.data_ + 0x40))->name).
                                field_2 + 8) = pcVar5;
              (((DataSegment *)((long)local_78.loc.filename.data_ + 0x40))->memory_var).loc.filename
              .data_ = pcVar5;
              *(bool *)&(((DataSegment *)((long)local_78.loc.filename.data_ + 0x40))->memory_var).
                        loc.filename.size_ = true;
              local_118._M_head_impl = (MemoryModuleField *)local_78.loc.filename.data_;
              local_78.loc.filename.data_ = (char *)0x0;
              Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                          *)&local_118);
              if (local_118._M_head_impl != (MemoryModuleField *)0x0) {
                (*((local_118._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
                  super_ModuleField._vptr_ModuleField[1])();
              }
              local_118._M_head_impl = (MemoryModuleField *)0x0;
              local_120._M_head_impl = local_138;
              local_138 = (DataSegmentModuleField *)0x0;
              Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                          *)&local_120);
              if (local_120._M_head_impl != (DataSegmentModuleField *)0x0) {
                (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
                   &(local_120._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->
                  super_ModuleField)._vptr_ModuleField[1])();
              }
              local_120._M_head_impl = (DataSegmentModuleField *)0x0;
              pDVar7 = local_138;
              if ((DataSegmentModuleField *)local_78.loc.filename.data_ !=
                  (DataSegmentModuleField *)0x0) {
                (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)local_78.loc.filename.data_)->
                  super_ModuleField)._vptr_ModuleField[1])();
                pDVar7 = local_138;
              }
            }
          }
          else {
            MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
                      ((wabt *)&local_78,&loc,&name);
            RVar3 = ParseLimits(this,(Limits *)
                                     ((long)&(((DataSegment *)
                                              ((long)local_78.loc.filename.data_ + 0x40))->name).
                                             field_2 + 8));
            pDVar7 = (DataSegmentModuleField *)local_78.loc.filename.data_;
            if (RVar3.enum_ != Error) {
              local_128._M_head_impl = (MemoryModuleField *)local_78.loc.filename.data_;
              local_78.loc.filename.data_ = (char *)0x0;
              Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                          *)&local_128);
              if ((DataSegmentModuleField *)local_128._M_head_impl != (DataSegmentModuleField *)0x0)
              {
                (*((local_128._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
                  super_ModuleField._vptr_ModuleField[1])();
              }
              local_128._M_head_impl = (MemoryModuleField *)0x0;
              pDVar7 = (DataSegmentModuleField *)local_78.loc.filename.data_;
            }
          }
          if (pDVar7 != (DataSegmentModuleField *)0x0) {
            (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
               &pDVar7->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>)->super_ModuleField).
              _vptr_ModuleField[1])();
          }
          if (RVar3.enum_ == Error) goto LAB_00169bdb;
        }
        anon_unknown_1::AppendInlineExportFields
                  (module,&export_fields,
                   (int)((ulong)((long)(module->memories).
                                       super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(module->memories).
                                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
        RVar3 = Expect(this,Rpar);
        EVar6 = (Enum)(RVar3.enum_ == Error);
      }
LAB_00169bdb:
      intrusive_list<wabt::ModuleField>::clear(&export_fields);
      std::__cxx11::string::_M_dispose();
      return (Result)EVar6;
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseMemoryModuleField(Module* module) {
  WABT_TRACE(ParseMemoryModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Memory);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Memory));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<MemoryImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimits(&import->memory.page_limits));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else if (MatchLpar(TokenType::Data)) {
    auto data_segment_field = MakeUnique<DataSegmentModuleField>(loc);
    DataSegment& data_segment = data_segment_field->data_segment;
    data_segment.memory_var = Var(module->memories.size());
    data_segment.offset.push_back(MakeUnique<ConstExpr>(Const::I32(0)));
    data_segment.offset.back().loc = loc;
    ParseTextListOpt(&data_segment.data);
    EXPECT(Rpar);

    auto memory_field = MakeUnique<MemoryModuleField>(loc, name);
    uint32_t byte_size = WABT_ALIGN_UP_TO_PAGE(data_segment.data.size());
    uint32_t page_size = WABT_BYTES_TO_PAGES(byte_size);
    memory_field->memory.page_limits.initial = page_size;
    memory_field->memory.page_limits.max = page_size;
    memory_field->memory.page_limits.has_max = true;

    module->AppendField(std::move(memory_field));
    module->AppendField(std::move(data_segment_field));
  } else {
    auto field = MakeUnique<MemoryModuleField>(loc, name);
    CHECK_RESULT(ParseLimits(&field->memory.page_limits));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->memories.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}